

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O1

SortedRun *
SortedRun::pick_common
          (SortedRun *__return_storage_ptr__,int cutoff,
          vector<SortedRun_*,_std::allocator<SortedRun_*>_> *sources)

{
  uint uVar1;
  pointer ppSVar2;
  SortedRun *pSVar3;
  pointer puVar4;
  int iVar5;
  int i;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  pointer ppVar11;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *p_Var12;
  ulong uVar13;
  uint *puVar14;
  pointer ppSVar15;
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  heads;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  FileId min_id;
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_88;
  pointer local_68;
  iterator iStack_60;
  pointer local_58;
  pair<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  SortedRun *local_38;
  
  local_58 = (pointer)0x0;
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::reserve(&local_88,
            (long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  ppSVar15 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar2 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar15 != ppSVar2) {
    do {
      pSVar3 = *ppSVar15;
      decompress(pSVar3);
      if (((pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish) ||
         ((pSVar3->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pSVar3->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        validate_compression(pSVar3,false);
        puVar4 = (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        validate_compression(pSVar3,false);
        local_48.second._M_current =
             (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_48.first._M_current = puVar4;
        std::
        vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
        ::
        emplace_back<std::pair<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                  ((vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                    *)&local_88,&local_48);
      }
      ppSVar15 = ppSVar15 + 1;
    } while (ppSVar15 != ppSVar2);
  }
  uVar9 = (ulong)((long)local_88.
                        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.
                       super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  if (cutoff <= (int)uVar9) {
    do {
      uVar8 = *((local_88.
                 super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first)._M_current;
      local_48.first._M_current._0_4_ = uVar8;
      iVar5 = 0;
      uVar7 = 0;
      if (1 < (int)uVar9) {
        uVar7 = 0;
        uVar13 = 1;
        ppVar11 = local_88.
                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          ppVar11 = ppVar11 + 1;
          uVar1 = *(ppVar11->first)._M_current;
          if (uVar1 < uVar8) {
            local_48.first._M_current._0_4_ = uVar1;
            uVar7 = uVar13 & 0xffffffff;
            uVar8 = uVar1;
          }
          uVar13 = uVar13 + 1;
        } while ((uVar9 & 0xffffffff) != uVar13);
      }
      if ((int)uVar7 <
          (int)((ulong)((long)local_88.
                              super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.
                             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        iVar5 = 0;
        do {
          iVar6 = (int)uVar7;
          puVar14 = local_88.
                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6].first._M_current;
          if (*puVar14 == (uint)local_48.first._M_current) {
            iVar5 = iVar5 + 1;
            puVar14 = puVar14 + 1;
            local_88.
            super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar6].first._M_current = puVar14;
            if (puVar14 ==
                local_88.
                super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar6].second._M_current) {
              if ((local_88.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)iVar6 + 1 !=
                   local_88.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
                 (lVar10 = (long)local_88.
                                 super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_88.
                                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)iVar6 + 1) >> 4,
                 0 < lVar10)) {
                lVar10 = lVar10 + 1;
                p_Var12 = &local_88.
                           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)iVar6 + 1].second;
                do {
                  p_Var12[-3] = (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 )(((pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     *)(p_Var12 + -1))->first)._M_current;
                  p_Var12[-2] = (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 )p_Var12->_M_current;
                  lVar10 = lVar10 + -1;
                  p_Var12 = p_Var12 + 2;
                } while (1 < lVar10);
              }
              local_88.
              super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              iVar6 = iVar6 + -1;
            }
          }
          uVar7 = (ulong)(iVar6 + 1U);
        } while ((int)(iVar6 + 1U) <
                 (int)((ulong)((long)local_88.
                                     super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.
                                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
      }
      if (cutoff <= iVar5) {
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                     (uint *)&local_48);
        }
        else {
          *iStack_60._M_current = (uint)local_48.first._M_current;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
      }
      uVar9 = (ulong)((long)local_88.
                            super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4;
    } while (cutoff <= (int)uVar9);
  }
  pSVar3 = local_38;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_68;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_60._M_current;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  local_58 = (pointer)0x0;
  local_68 = (pointer)0x0;
  iStack_60._M_current = (uint *)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_88.
      super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return pSVar3;
}

Assistant:

SortedRun SortedRun::pick_common(int cutoff,
                                 std::vector<SortedRun *> &sources) {
    // returns all FileIds which appear at least `cutoff` times among provided
    // `sources`
    using FileIdRange = std::pair<std::vector<FileId>::const_iterator,
                                  std::vector<FileId>::const_iterator>;
    std::vector<FileId> result;
    std::vector<FileIdRange> heads;
    heads.reserve(sources.size());

    for (auto source : sources) {
        source->decompress();
        if (!source->empty()) {
            heads.emplace_back(std::make_pair(source->begin(), source->end()));
        }
    }

    while (static_cast<int>(heads.size()) >= cutoff) {
        // pick lowest possible FileId value among all current heads
        int min_index = 0;
        FileId min_id = *heads[0].first;
        for (int i = 1; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first < min_id) {
                min_index = i;
                min_id = *heads[i].first;
            }
        }

        // fix on that particular value selected in previous step and count
        // number of repetitions among heads.
        // Note that it's implementation-defined that std::vector<FileId>
        // is always sorted and we use this fact here.
        int repeat_count = 0;
        for (int i = min_index; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first == min_id) {
                repeat_count += 1;
                heads[i].first++;
                // head ended, we may get rid of it
                if (heads[i].first == heads[i].second) {
                    heads.erase(heads.begin() + i);
                    i--;  // Be careful not to skip elements!
                }
            }
        }

        // this value has enough repetitions among different heads to add it to
        // the result set
        if (repeat_count >= cutoff) {
            result.push_back(min_id);
        }
    }

    return SortedRun(std::move(result));
}